

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha1_Raw(sha2_byte *data,size_t len,uint8_t *digest)

{
  SHA1_CTX context;
  SHA1_CTX local_80;
  
  sha1_Init(&local_80);
  sha1_Update(&local_80,data,len);
  sha1_Final(&local_80,digest);
  return;
}

Assistant:

void sha1_Raw(const sha2_byte* data, size_t len, uint8_t digest[SHA1_DIGEST_LENGTH]) {
    trezor::SHA1_CTX	context;
	sha1_Init(&context);
	sha1_Update(&context, data, len);
	sha1_Final(&context, digest);
}